

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quantize.cpp
# Opt level: O3

void nv::Quantize::BinaryAlpha(Image *image,int alpha_threshold)

{
  Color32 CVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  anon_union_4_2_12391d8d_for_Color32_0 *paVar6;
  uint uVar7;
  uint uVar8;
  
  if (image == (Image *)0x0) {
    iVar2 = nvAbort("image != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/Quantize.cpp"
                    ,0x1e,"void nv::Quantize::BinaryAlpha(Image *, int)");
    if (iVar2 == 1) {
      raise(5);
    }
  }
  uVar3 = Image::width(image);
  uVar4 = Image::height(image);
  if (uVar4 != 0) {
    uVar7 = 0;
    do {
      if (uVar3 != 0) {
        uVar8 = 0;
        do {
          uVar5 = Image::width(image);
          paVar6 = &Image::pixel(image,uVar5 * uVar7 + uVar8)->field_0;
          CVar1.field_0 = (anon_union_4_2_12391d8d_for_Color32_0)paVar6->u;
          uVar5 = Image::width(image);
          paVar6 = &Image::pixel(image,uVar5 * uVar7 + uVar8)->field_0;
          *paVar6 = (anon_union_4_2_12391d8d_for_Color32_0)
                    ((uint)((int)((uint)CVar1.field_0 >> 0x18) <= alpha_threshold) * 0x1000000 +
                     ((uint)CVar1.field_0 & 0xffffff) + -0x1000000);
          uVar8 = uVar8 + 1;
        } while (uVar3 != uVar8);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar4);
  }
  return;
}

Assistant:

void nv::Quantize::BinaryAlpha( Image * image, int alpha_threshold /*= 127*/ )
{
	nvCheck(image != NULL);
	
	const uint w = image->width();
	const uint h = image->height();
	
	for(uint y = 0; y < h; y++) {
		for(uint x = 0; x < w; x++) {
			
			Color32 pixel = image->pixel(x, y);
			
			// Convert color.
			if( pixel.a > alpha_threshold ) pixel.a = 255;
			else pixel.a = 0;
			
			// Store color.
			image->pixel(x, y) = pixel;
		}
	}
}